

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O0

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  size_type sVar5;
  reference pbVar6;
  long lVar7;
  ostream *poVar8;
  char *pcVar9;
  cmTarget *pcVar10;
  PolicyID id;
  byte local_e38;
  allocator local_e19;
  string local_e18;
  allocator local_df1;
  string local_df0;
  cmTarget *local_dd0;
  cmTarget *tgt;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dc0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_db8;
  undefined1 local_db0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string local_d90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d70;
  undefined1 local_d68 [8];
  string msg;
  undefined1 local_d28 [8];
  ostringstream e_6;
  string local_bb0;
  undefined1 local_b90 [8];
  ostringstream e_5;
  string local_a18;
  undefined1 local_9f8 [8];
  ostringstream e_4;
  undefined1 local_878 [4];
  TargetType type;
  undefined1 local_858 [8];
  ostringstream e_3;
  allocator local_6d9;
  string local_6d8;
  cmTarget *local_6b8;
  cmTarget *aliasedTarget;
  undefined1 local_690 [8];
  ostringstream e_2;
  allocator local_511;
  string local_510;
  char *local_4f0;
  char *aliasedName;
  undefined1 local_4c8 [8];
  ostringstream e_1;
  allocator local_349;
  string local_348;
  allocator local_321;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  uint local_264;
  string local_260;
  string local_240;
  byte local_219;
  undefined1 local_218 [7];
  bool issueMessage;
  ostringstream e;
  MessageType local_a0;
  bool local_99;
  MessageType messageType;
  bool nameOk;
  byte local_8e;
  byte local_8d;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  byte local_89;
  undefined1 local_88 [2];
  bool isAlias;
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  bool use_macbundle;
  bool use_win32;
  string exename;
  const_iterator s;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddExecutableCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar5 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_006831f6;
  }
  exename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&exename.field_2 + 8));
  std::__cxx11::string::string((string *)local_88,(string *)pbVar6);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&exename.field_2 + 8));
  local_89 = 0;
  local_8a = 0;
  local_8b = 0;
  local_8c = 0;
  local_8d = 0;
  local_8e = 0;
LAB_00681c71:
  _messageType = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
  bVar2 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&exename.field_2 + 8),
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&messageType);
  if (bVar2) {
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&exename.field_2 + 8));
    bVar2 = std::operator==(pbVar6,"WIN32");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&exename.field_2 + 8));
      local_89 = 1;
    }
    else {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&exename.field_2 + 8));
      bVar2 = std::operator==(pbVar6,"MACOSX_BUNDLE");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&exename.field_2 + 8));
        local_8a = 1;
      }
      else {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&exename.field_2 + 8));
        bVar2 = std::operator==(pbVar6,"EXCLUDE_FROM_ALL");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&exename.field_2 + 8));
          local_8b = 1;
        }
        else {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&exename.field_2 + 8));
          bVar2 = std::operator==(pbVar6,"IMPORTED");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&exename.field_2 + 8));
            local_8c = 1;
          }
          else {
            if ((local_8c & 1) != 0) {
              pbVar6 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&exename.field_2 + 8));
              bVar2 = std::operator==(pbVar6,"GLOBAL");
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&exename.field_2 + 8));
                local_8d = 1;
                goto LAB_00681c71;
              }
            }
            pbVar6 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&exename.field_2 + 8));
            bVar2 = std::operator==(pbVar6,"ALIAS");
            if (!bVar2) goto LAB_00681e45;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&exename.field_2 + 8));
            local_8e = 1;
          }
        }
      }
    }
    goto LAB_00681c71;
  }
LAB_00681e45:
  bVar2 = cmGeneratorExpression::IsValidTargetName((string *)local_88);
  local_e38 = 0;
  if (bVar2) {
    bVar2 = cmGlobalGenerator::IsReservedTarget((string *)local_88);
    local_e38 = bVar2 ^ 0xff;
  }
  local_99 = (bool)(local_e38 & 1);
  if (((local_99 != false) && ((local_8c & 1) == 0)) && ((local_8e & 1) == 0)) {
    lVar7 = std::__cxx11::string::find(local_88,0x98770c);
    local_99 = lVar7 == -1;
  }
  if (local_99 == false) {
    local_a0 = AUTHOR_WARNING;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    local_219 = 0;
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_240,(cmPolicies *)0x25,id);
        poVar8 = std::operator<<((ostream *)local_218,(string *)&local_240);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_240);
        local_219 = 1;
      }
      else if (PVar3 - NEW < 3) {
        local_219 = 1;
        local_a0 = FATAL_ERROR;
      }
    }
    if ((local_219 & 1) == 0) {
LAB_006820d1:
      local_264 = 0;
    }
    else {
      poVar8 = std::operator<<((ostream *)local_218,"The target name \"");
      poVar8 = std::operator<<(poVar8,(string *)local_88);
      std::operator<<(poVar8,
                      "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                     );
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,local_a0,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      if (local_a0 != FATAL_ERROR) goto LAB_006820d1;
      this_local._7_1_ = 0;
      local_264 = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
    if (local_264 == 0) goto LAB_0068210a;
  }
  else {
LAB_0068210a:
    if (((local_8c & 1) == 0) ||
       ((((local_89 & 1) == 0 && ((local_8a & 1) == 0)) && ((local_8b & 1) == 0)))) {
      if ((local_8e & 1) == 0) {
        if ((local_8c & 1) == 0) {
          std::__cxx11::string::string((string *)local_d68);
          bVar2 = cmMakefile::EnforceUniqueName
                            ((this->super_cmCommand).Makefile,(string *)local_88,(string *)local_d68
                             ,false);
          if (!bVar2) {
            cmCommand::SetError(&this->super_cmCommand,(string *)local_d68);
            this_local._7_1_ = 0;
          }
          local_264 = (uint)!bVar2;
          std::__cxx11::string::~string((string *)local_d68);
          if (local_264 == 0) {
            local_d70._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
            bVar2 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&exename.field_2 + 8),&local_d70);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_d90,
                         "called with incorrect number of arguments, no sources provided",
                         (allocator *)
                         ((long)&srclists.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmCommand::SetError(&this->super_cmCommand,&local_d90);
              std::__cxx11::string::~string((string *)&local_d90);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&srclists.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              this_local._7_1_ = 0;
              local_264 = 1;
            }
            else {
              local_db8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   exename.field_2._8_8_;
              local_dc0._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&tgt + 7));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_db0,local_db8,local_dc0,
                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&tgt + 7));
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&tgt + 7));
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar9 = (char *)std::__cxx11::string::c_str();
              pcVar10 = cmMakefile::AddExecutable
                                  (pcVar1,pcVar9,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_db0,(bool)(local_8b & 1));
              local_dd0 = pcVar10;
              if ((local_89 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_df0,"WIN32_EXECUTABLE",&local_df1);
                cmTarget::SetProperty(pcVar10,&local_df0,"ON");
                std::__cxx11::string::~string((string *)&local_df0);
                std::allocator<char>::~allocator((allocator<char> *)&local_df1);
              }
              pcVar10 = local_dd0;
              if ((local_8a & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_e18,"MACOSX_BUNDLE",&local_e19);
                cmTarget::SetProperty(pcVar10,&local_e18,"ON");
                std::__cxx11::string::~string((string *)&local_e18);
                std::allocator<char>::~allocator((allocator<char> *)&local_e19);
              }
              this_local._7_1_ = 1;
              local_264 = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_db0);
            }
          }
        }
        else {
          pcVar10 = cmMakefile::FindTargetToUse
                              ((this->super_cmCommand).Makefile,(string *)local_88,false);
          if (pcVar10 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget
                      ((this->super_cmCommand).Makefile,(string *)local_88,EXECUTABLE,
                       (bool)(local_8d & 1));
            this_local._7_1_ = 1;
            local_264 = 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
            poVar8 = std::operator<<((ostream *)local_d28,"cannot create imported target \"");
            poVar8 = std::operator<<(poVar8,(string *)local_88);
            std::operator<<(poVar8,"\" because another target with the same name already exists.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&msg.field_2 + 8));
            std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            local_264 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d28);
          }
        }
      }
      else {
        bVar2 = cmGeneratorExpression::IsValidTargetName((string *)local_88);
        if (bVar2) {
          if ((local_8b & 1) == 0) {
            if (((local_8c & 1) == 0) && ((local_8d & 1) == 0)) {
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local);
              if (sVar5 == 3) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&exename.field_2 + 8));
                pcVar9 = (char *)std::__cxx11::string::c_str();
                pcVar1 = (this->super_cmCommand).Makefile;
                local_4f0 = pcVar9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_510,pcVar9,&local_511);
                bVar2 = cmMakefile::IsAlias(pcVar1,&local_510);
                std::__cxx11::string::~string((string *)&local_510);
                std::allocator<char>::~allocator((allocator<char> *)&local_511);
                pcVar9 = local_4f0;
                if (bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_690);
                  poVar8 = std::operator<<((ostream *)local_690,"cannot create ALIAS target \"");
                  poVar8 = std::operator<<(poVar8,(string *)local_88);
                  poVar8 = std::operator<<(poVar8,"\" because target \"");
                  poVar8 = std::operator<<(poVar8,local_4f0);
                  std::operator<<(poVar8,"\" is itself an ALIAS.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedTarget);
                  std::__cxx11::string::~string((string *)&aliasedTarget);
                  this_local._7_1_ = 0;
                  local_264 = 1;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_690);
                }
                else {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_6d8,pcVar9,&local_6d9);
                  pcVar10 = cmMakefile::FindTargetToUse(pcVar1,&local_6d8,true);
                  std::__cxx11::string::~string((string *)&local_6d8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
                  local_6b8 = pcVar10;
                  if (pcVar10 == (cmTarget *)0x0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_858);
                    poVar8 = std::operator<<((ostream *)local_858,"cannot create ALIAS target \"");
                    poVar8 = std::operator<<(poVar8,(string *)local_88);
                    poVar8 = std::operator<<(poVar8,"\" because target \"");
                    poVar8 = std::operator<<(poVar8,local_4f0);
                    std::operator<<(poVar8,"\" does not already exist.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_878);
                    std::__cxx11::string::~string((string *)local_878);
                    this_local._7_1_ = 0;
                    local_264 = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_858);
                  }
                  else {
                    TVar4 = cmTarget::GetType(pcVar10);
                    if (TVar4 == EXECUTABLE) {
                      bVar2 = cmTarget::IsImported(local_6b8);
                      if (bVar2) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
                        poVar8 = std::operator<<((ostream *)local_b90,
                                                 "cannot create ALIAS target \"");
                        poVar8 = std::operator<<(poVar8,(string *)local_88);
                        poVar8 = std::operator<<(poVar8,"\" because target \"");
                        poVar8 = std::operator<<(poVar8,local_4f0);
                        std::operator<<(poVar8,"\" is IMPORTED.");
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(&this->super_cmCommand,&local_bb0);
                        std::__cxx11::string::~string((string *)&local_bb0);
                        this_local._7_1_ = 0;
                        local_264 = 1;
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
                      }
                      else {
                        cmMakefile::AddAlias
                                  ((this->super_cmCommand).Makefile,(string *)local_88,local_6b8);
                        this_local._7_1_ = 1;
                        local_264 = 1;
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9f8);
                      poVar8 = std::operator<<((ostream *)local_9f8,"cannot create ALIAS target \"")
                      ;
                      poVar8 = std::operator<<(poVar8,(string *)local_88);
                      poVar8 = std::operator<<(poVar8,"\" because target \"");
                      poVar8 = std::operator<<(poVar8,local_4f0);
                      std::operator<<(poVar8,"\" is not an executable.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_a18);
                      std::__cxx11::string::~string((string *)&local_a18);
                      this_local._7_1_ = 0;
                      local_264 = 1;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9f8);
                    }
                  }
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                std::operator<<((ostream *)local_4c8,"ALIAS requires exactly one target argument.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedName);
                std::__cxx11::string::~string((string *)&aliasedName);
                this_local._7_1_ = 0;
                local_264 = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_348,"IMPORTED with ALIAS is not allowed.",&local_349);
              cmCommand::SetError(&this->super_cmCommand,&local_348);
              std::__cxx11::string::~string((string *)&local_348);
              std::allocator<char>::~allocator((allocator<char> *)&local_349);
              this_local._7_1_ = 0;
              local_264 = 1;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_320,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",&local_321
                      );
            cmCommand::SetError(&this->super_cmCommand,&local_320);
            std::__cxx11::string::~string((string *)&local_320);
            std::allocator<char>::~allocator((allocator<char> *)&local_321);
            this_local._7_1_ = 0;
            local_264 = 1;
          }
        }
        else {
          std::operator+(&local_300,"Invalid name for ALIAS: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          cmCommand::SetError(&this->super_cmCommand,&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          this_local._7_1_ = 0;
          local_264 = 1;
        }
      }
    }
    else {
      if ((local_89 & 1) == 0) {
        if ((local_8a & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2d8,
                     "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",&local_2d9);
          cmCommand::SetError(&this->super_cmCommand,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2b0,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                     &local_2b1);
          cmCommand::SetError(&this->super_cmCommand,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_288,"may not be given WIN32 for an IMPORTED target.",&local_289)
        ;
        cmCommand::SetError(&this->super_cmCommand,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
      }
      this_local._7_1_ = 0;
      local_264 = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_88);
LAB_006831f6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddExecutableCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while ( s != args.end() )
    {
    if (*s == "WIN32")
      {
      ++s;
      use_win32 = true;
      }
    else if ( *s == "MACOSX_BUNDLE" )
      {
      ++s;
      use_macbundle = true;
      }
    else if(*s == "EXCLUDE_FROM_ALL")
      {
      ++s;
      excludeFromAll = true;
      }
    else if(*s == "IMPORTED")
     {
     ++s;
     importTarget = true;
     }
    else if(importTarget && *s == "GLOBAL")
      {
      ++s;
      importGlobal = true;
      }
    else if(*s == "ALIAS")
      {
      ++s;
      isAlias = true;
      }
    else
      {
      break;
      }
    }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias)
    {
    nameOk = exename.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << exename <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // Special modifiers are not allowed with IMPORTED signature.
  if(importTarget
      && (use_win32 || use_macbundle || excludeFromAll))
    {
    if(use_win32)
      {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
      }
    else if(use_macbundle)
      {
      this->SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
      }
    else // if(excludeFromAll)
      {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
      }
    return false;
    }
  if (isAlias)
    {
    if(!cmGeneratorExpression::IsValidTargetName(exename))
      {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
      }
    if(excludeFromAll)
      {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
      }
    if(importTarget || importGlobal)
      {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
      }
    if(args.size() != 3)
      {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
      }

    const char *aliasedName = s->c_str();
    if(this->Makefile->IsAlias(aliasedName))
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
      }
    cmTarget *aliasedTarget =
                    this->Makefile->FindTargetToUse(aliasedName, true);
    if(!aliasedTarget)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" does not already "
        "exist.";
      this->SetError(e.str());
      return false;
      }
    cmTarget::TargetType type = aliasedTarget->GetType();
    if(type != cmTarget::EXECUTABLE)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is not an "
        "executable.";
      this->SetError(e.str());
      return false;
      }
    if(aliasedTarget->IsImported())
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    this->Makefile->AddAlias(exename, aliasedTarget);
    return true;
    }

  // Handle imported target creation.
  if(importTarget)
    {
    // Make sure the target does not already exist.
    if(this->Makefile->FindTargetToUse(exename))
      {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
      }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmTarget::EXECUTABLE,
                                      importGlobal);
    return true;
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(exename, msg))
    {
    this->SetError(msg);
    return false;
    }
  }

  if (s == args.end())
    {
    this->SetError
      ("called with incorrect number of arguments, no sources provided");
    return false;
    }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = this->Makefile->AddExecutable(exename.c_str(), srclists,
                                                excludeFromAll);
  if ( use_win32 )
    {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
    }
  if ( use_macbundle)
    {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
    }

  return true;
}